

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonsterCards.cpp
# Opt level: O1

void __thiscall DeckOfMonsterCards::DeckOfMonsterCards(DeckOfMonsterCards *this)

{
  MonsterOptions MVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  MonsterCards singleCard;
  MonsterCards MStack_f8;
  
  (this->deck).super__Vector_base<MonsterCards,_std::allocator<MonsterCards>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->it)._M_current = (MonsterCards *)0x0;
  (this->deck).super__Vector_base<MonsterCards,_std::allocator<MonsterCards>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deck).super__Vector_base<MonsterCards,_std::allocator<MonsterCards>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<MonsterCards,_std::allocator<MonsterCards>_>::reserve(&this->deck,6);
  MVar1 = CaptainFish;
  do {
    MonsterCards::MonsterCards(&MStack_f8);
    MStack_f8.assigned = false;
    MStack_f8.card = MVar1;
    std::vector<MonsterCards,_std::allocator<MonsterCards>_>::push_back(&this->deck,&MStack_f8);
    lVar3 = -0xc0;
    paVar2 = &MStack_f8.MonsterNames[5].field_2;
    do {
      if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar2->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar2->_M_allocated_capacity)[-2],
                        paVar2->_M_allocated_capacity + 1);
      }
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar2->_M_allocated_capacity + -4);
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    MVar1 = MVar1 + Sheriff;
  } while (MVar1 != EnumEnd);
  return;
}

Assistant:

DeckOfMonsterCards::DeckOfMonsterCards() {
    deck.reserve(6);
    for(int i=0; i< MonsterCards::EnumEnd; i++) {
        auto current = (MonsterCards::MonsterOptions) i;
        MonsterCards singleCard;
        singleCard.setMonster(current);
        deck.push_back(singleCard);
    }
}